

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall wabt::interp::Thread::DoConvert<float,long>(Thread *this,Ptr *out_trap)

{
  undefined8 extraout_RDX;
  float fVar1;
  Value VVar2;
  
  VVar2 = Pop(this);
  fVar1 = wabt_convert_int64_to_float(VVar2.i64_);
  VVar2.i64_._4_4_ = 0;
  VVar2.f32_ = (f32)fVar1;
  VVar2._8_8_ = extraout_RDX;
  Push(this,VVar2);
  return Ok;
}

Assistant:

RunResult Thread::DoConvert(Trap::Ptr* out_trap) {
  auto val = Pop<T>();
  if (std::is_integral<R>::value && std::is_floating_point<T>::value) {
    // Don't use std::isnan here because T may be a non-floating-point type.
    TRAP_IF(IsNaN(val), "invalid conversion to integer");
  }
  TRAP_UNLESS(CanConvert<R>(val), "integer overflow");
  Push<R>(Convert<R>(val));
  return RunResult::Ok;
}